

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_events.c
# Opt level: O2

void mouse_move(mfb_window *window,int x,int y)

{
  return;
}

Assistant:

void 
mouse_move(struct mfb_window *window, int x, int y) {
    kUnused(window);
    kUnused(x);
    kUnused(y);
    // const char *window_title = "";
    // if(window) {
    //     window_t(const char *) itle = mfb_get_user_data(window);
    // }
    //fprintf(stdout, "%s > mouse_move: %d, %d\n", window_title, x, y);
}